

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool>
               (interval_t *ldata,double *rdata,interval_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  ValidityMask *pVVar4;
  ValidityMask *pVVar5;
  idx_t iVar6;
  int64_t *piVar7;
  ValidityMask *pVVar8;
  interval_t iVar9;
  interval_t left;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    piVar7 = &result_data->micros;
    iVar6 = count;
    for (pVVar8 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar8;
        pVVar8 = (ValidityMask *)
                 ((long)&(pVVar8->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      pVVar4 = pVVar8;
      if (lsel->sel_vector != (sel_t *)0x0) {
        pVVar4 = (ValidityMask *)(ulong)lsel->sel_vector[(long)pVVar8];
      }
      pVVar5 = pVVar8;
      if (rsel->sel_vector != (sel_t *)0x0) {
        pVVar5 = (ValidityMask *)(ulong)rsel->sel_vector[(long)pVVar8];
      }
      uVar1 = ldata[(long)pVVar4].months;
      left.micros = (int64_t)result_validity;
      left._0_8_ = ldata[(long)pVVar4].micros;
      iVar9 = BinaryZeroIsNullWrapper::
              Operation<bool,duckdb::DivideOperator,duckdb::interval_t,double,duckdb::interval_t>
                        ((BinaryZeroIsNullWrapper *)(ulong)fun,SUB41(uVar1,0),left,
                         rdata[(long)pVVar5],pVVar8,iVar6);
      ((interval_t *)(piVar7 + -1))->months = (int)iVar9._0_8_;
      ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar9._0_8_ >> 0x20);
      *piVar7 = iVar9.micros;
      piVar7 = piVar7 + 2;
    }
  }
  else {
    piVar7 = &result_data->micros;
    iVar6 = count;
    for (pVVar8 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar8;
        pVVar8 = (ValidityMask *)
                 ((long)&(pVVar8->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      pVVar4 = pVVar8;
      if (lsel->sel_vector != (sel_t *)0x0) {
        pVVar4 = (ValidityMask *)(ulong)lsel->sel_vector[(long)pVVar8];
      }
      pVVar5 = pVVar8;
      if (rsel->sel_vector != (sel_t *)0x0) {
        pVVar5 = (ValidityMask *)(ulong)rsel->sel_vector[(long)pVVar8];
      }
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,(idx_t)pVVar4);
      if (bVar3) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,(idx_t)pVVar5);
        if (!bVar3) goto LAB_0151410d;
        uVar2 = ldata[(long)pVVar4].months;
        iVar9.micros = (int64_t)result_validity;
        iVar9._0_8_ = ldata[(long)pVVar4].micros;
        iVar9 = BinaryZeroIsNullWrapper::
                Operation<bool,duckdb::DivideOperator,duckdb::interval_t,double,duckdb::interval_t>
                          ((BinaryZeroIsNullWrapper *)(ulong)fun,SUB41(uVar2,0),iVar9,
                           rdata[(long)pVVar5],pVVar8,iVar6);
        ((interval_t *)(piVar7 + -1))->months = (int)iVar9._0_8_;
        ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar9._0_8_ >> 0x20);
        *piVar7 = iVar9.micros;
      }
      else {
LAB_0151410d:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,(idx_t)pVVar8);
      }
      piVar7 = piVar7 + 2;
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}